

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O0

void __thiscall Vector4f::Vector4f(Vector4f *this,float x,Vector3f *yzw)

{
  Vector3f *in_RSI;
  undefined4 *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  
  *in_RDI = in_XMM0_Da;
  fVar1 = Vector3f::x(in_RSI);
  in_RDI[1] = fVar1;
  fVar1 = Vector3f::y(in_RSI);
  in_RDI[2] = fVar1;
  fVar1 = Vector3f::z(in_RSI);
  in_RDI[3] = fVar1;
  return;
}

Assistant:

Vector4f::Vector4f( float x, const Vector3f& yzw )
{
	m_elements[0] = x;
	m_elements[1] = yzw.x();
	m_elements[2] = yzw.y();
	m_elements[3] = yzw.z();
}